

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

Matrix<double> * __thiscall
nnad::Matrix<double>::PseudoInverse_LLR(Matrix<double> *__return_storage_ptr__,Matrix<double> *this)

{
  Matrix<double> transpose;
  Matrix<double> temp_inverse;
  Matrix<double> temp;
  Matrix<double> MStack_78;
  Matrix<double> local_58;
  Matrix<double> local_38;
  
  Matrix(&MStack_78,this);
  Transpose(&MStack_78);
  operator*(&local_38,this,&MStack_78);
  Inverse(&local_58,&local_38);
  operator*(__return_storage_ptr__,&MStack_78,&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_58._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_38._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&MStack_78._Matrix.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> PseudoInverse_LLR()
    {
      Matrix<T> transpose = (*this);
      transpose.Transpose();
      Matrix<T> temp = (*this) * transpose;
      Matrix<T> temp_inverse = temp.Inverse();
      Matrix<T> output = transpose * temp_inverse;
      return output;
    }